

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

bool __thiscall google::protobuf::TextFormat::Parser::ParserImpl::SkipFieldValue(ParserImpl *this)

{
  bool bVar1;
  Token *pTVar2;
  byte local_181;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  undefined1 local_138 [8];
  string text;
  string local_110;
  byte local_ea;
  allocator local_e9;
  undefined1 local_e8 [6];
  bool has_minus;
  allocator local_c1;
  string local_c0;
  byte local_9b;
  byte local_9a;
  allocator local_99;
  string local_98;
  allocator local_71;
  string local_70;
  allocator local_39;
  string local_38;
  ParserImpl *local_18;
  ParserImpl *this_local;
  
  local_18 = this;
  bVar1 = LookingAtType(this,TYPE_STRING);
  if (bVar1) {
    while (bVar1 = LookingAtType(this,TYPE_STRING), bVar1) {
      io::Tokenizer::Next(&this->tokenizer_);
    }
    this_local._7_1_ = 1;
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_38,"[",&local_39);
    bVar1 = TryConsume(this,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
    if (bVar1) {
      do {
        std::allocator<char>::allocator();
        local_9a = 0;
        local_9b = 0;
        std::__cxx11::string::string((string *)&local_70,"{",&local_71);
        bVar1 = LookingAt(this,&local_70);
        local_181 = 0;
        if (!bVar1) {
          std::allocator<char>::allocator();
          local_9a = 1;
          std::__cxx11::string::string((string *)&local_98,"<",&local_99);
          local_9b = 1;
          bVar1 = LookingAt(this,&local_98);
          local_181 = bVar1 ^ 0xff;
        }
        if ((local_9b & 1) != 0) {
          std::__cxx11::string::~string((string *)&local_98);
        }
        if ((local_9a & 1) != 0) {
          std::allocator<char>::~allocator((allocator<char> *)&local_99);
        }
        std::__cxx11::string::~string((string *)&local_70);
        std::allocator<char>::~allocator((allocator<char> *)&local_71);
        if ((local_181 & 1) == 0) {
          bVar1 = SkipFieldMessage(this);
          if (!bVar1) {
            this_local._7_1_ = 0;
            goto LAB_005a23f1;
          }
        }
        else {
          bVar1 = SkipFieldValue(this);
          if (!bVar1) {
            this_local._7_1_ = 0;
            goto LAB_005a23f1;
          }
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_c0,"]",&local_c1);
        bVar1 = TryConsume(this,&local_c0);
        std::__cxx11::string::~string((string *)&local_c0);
        std::allocator<char>::~allocator((allocator<char> *)&local_c1);
        if (bVar1) {
          this_local._7_1_ = 1;
          goto LAB_005a23f1;
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)local_e8,",",&local_e9);
        bVar1 = Consume(this,(string *)local_e8);
        std::__cxx11::string::~string((string *)local_e8);
        std::allocator<char>::~allocator((allocator<char> *)&local_e9);
      } while (bVar1);
      this_local._7_1_ = 0;
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_110,"-",(allocator *)(text.field_2._M_local_buf + 0xf));
      bVar1 = TryConsume(this,&local_110);
      std::__cxx11::string::~string((string *)&local_110);
      std::allocator<char>::~allocator((allocator<char> *)(text.field_2._M_local_buf + 0xf));
      local_ea = bVar1;
      bVar1 = LookingAtType(this,TYPE_INTEGER);
      if (((bVar1) || (bVar1 = LookingAtType(this,TYPE_FLOAT), bVar1)) ||
         (bVar1 = LookingAtType(this,TYPE_IDENTIFIER), bVar1)) {
        if (((local_ea & 1) != 0) && (bVar1 = LookingAtType(this,TYPE_IDENTIFIER), bVar1)) {
          pTVar2 = io::Tokenizer::current(&this->tokenizer_);
          std::__cxx11::string::string((string *)local_138,(string *)&pTVar2->text);
          LowerString((string *)local_138);
          bVar1 = std::operator!=((string *)local_138,"inf");
          if ((bVar1) &&
             ((bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_138,"infinity"), bVar1 &&
              (bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_138,"nan"), bVar1)))) {
            std::operator+(&local_158,"Invalid float number: ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_138);
            ReportError(this,&local_158);
            std::__cxx11::string::~string((string *)&local_158);
            this_local._7_1_ = 0;
            bVar1 = true;
          }
          else {
            bVar1 = false;
          }
          std::__cxx11::string::~string((string *)local_138);
          if (bVar1) goto LAB_005a23f1;
        }
        io::Tokenizer::Next(&this->tokenizer_);
        this_local._7_1_ = 1;
      }
      else {
        this_local._7_1_ = 0;
      }
    }
  }
LAB_005a23f1:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool SkipFieldValue() {
    if (LookingAtType(io::Tokenizer::TYPE_STRING)) {
      while (LookingAtType(io::Tokenizer::TYPE_STRING)) {
        tokenizer_.Next();
      }
      return true;
    }
    if (TryConsume("[")) {
      while (true) {
        if (!LookingAt("{") && !LookingAt("<")) {
          DO(SkipFieldValue());
        } else {
          DO(SkipFieldMessage());
        }
        if (TryConsume("]")) {
          break;
        }
        DO(Consume(","));
      }
      return true;
    }
    // Possible field values other than string:
    //   12345        => TYPE_INTEGER
    //   -12345       => TYPE_SYMBOL + TYPE_INTEGER
    //   1.2345       => TYPE_FLOAT
    //   -1.2345      => TYPE_SYMBOL + TYPE_FLOAT
    //   inf          => TYPE_IDENTIFIER
    //   -inf         => TYPE_SYMBOL + TYPE_IDENTIFIER
    //   TYPE_INTEGER => TYPE_IDENTIFIER
    // Divides them into two group, one with TYPE_SYMBOL
    // and the other without:
    //   Group one:
    //     12345        => TYPE_INTEGER
    //     1.2345       => TYPE_FLOAT
    //     inf          => TYPE_IDENTIFIER
    //     TYPE_INTEGER => TYPE_IDENTIFIER
    //   Group two:
    //     -12345       => TYPE_SYMBOL + TYPE_INTEGER
    //     -1.2345      => TYPE_SYMBOL + TYPE_FLOAT
    //     -inf         => TYPE_SYMBOL + TYPE_IDENTIFIER
    // As we can see, the field value consists of an optional '-' and one of
    // TYPE_INTEGER, TYPE_FLOAT and TYPE_IDENTIFIER.
    bool has_minus = TryConsume("-");
    if (!LookingAtType(io::Tokenizer::TYPE_INTEGER) &&
        !LookingAtType(io::Tokenizer::TYPE_FLOAT) &&
        !LookingAtType(io::Tokenizer::TYPE_IDENTIFIER)) {
      return false;
    }
    // Combination of '-' and TYPE_IDENTIFIER may result in an invalid field
    // value while other combinations all generate valid values.
    // We check if the value of this combination is valid here.
    // TYPE_IDENTIFIER after a '-' should be one of the float values listed
    // below:
    //   inf, inff, infinity, nan
    if (has_minus && LookingAtType(io::Tokenizer::TYPE_IDENTIFIER)) {
      string text = tokenizer_.current().text;
      LowerString(&text);
      if (text != "inf" &&
          text != "infinity" &&
          text != "nan") {
        ReportError("Invalid float number: " + text);
        return false;
      }
    }
    tokenizer_.Next();
    return true;
  }